

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_20c1::DataDump<long>::Run(DataDump<long> *this,istream *input_stream)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  int iVar5;
  long data;
  char buffer [128];
  char local_d1;
  long local_d0;
  string *local_c8;
  istream *local_c0;
  char local_b8 [136];
  int iVar6;
  
  iVar5 = this->minimum_index_;
  local_c0 = input_stream;
  bVar1 = sptk::ReadStream<long>(&local_d0,input_stream);
  bVar2 = true;
  if (bVar1) {
    local_c8 = &this->print_format_;
    do {
      bVar2 = sptk::SnPrintf<long>(local_d0,local_c8,0x80,local_b8);
      if (!bVar2) {
        return bVar2;
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
      local_d1 = '\t';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_d1,1);
      sVar4 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_b8,sVar4);
      local_d1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_d1,1);
      iVar6 = this->minimum_index_ + -1;
      if (this->maximum_index_ != iVar5) {
        iVar6 = iVar5;
      }
      if (this->maximum_index_ == -1) {
        iVar6 = iVar5;
      }
      iVar5 = iVar6 + 1;
      bVar1 = sptk::ReadStream<long>(&local_d0,local_c0);
    } while (bVar1);
  }
  return bVar2;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    T data;
    for (int index(minimum_index_); sptk::ReadStream(&data, input_stream);
         ++index) {
      // Format data.
      if (!sptk::SnPrintf(data, print_format_, sizeof(buffer), buffer)) {
        return false;
      }

      // Dump data. Note that std::endl makes the execution speed slow.
      std::cout << index << '\t' << buffer << '\n';

      // Initialize index.
      if (maximum_index_ != kMagicNumberForEndOfFile &&
          maximum_index_ == index) {
        index = minimum_index_ - 1;
      }
    }
    return true;
  }